

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O0

uint16_t __thiscall chipemu::implementation::nmos::changed_pop(nmos *this)

{
  bool bVar1;
  reference puVar2;
  iterator iVar3;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_20;
  uint16_t local_12;
  nmos *pnStack_10;
  uint16_t id;
  nmos *this_local;
  
  pnStack_10 = this;
  bVar1 = __gnu_cxx::operator!=(&this->changed_eating,&this->changed_feeding);
  if (bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&this->changed_eating);
    local_12 = *puVar2;
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&this->changed_eating);
    local_20._M_current =
         (unsigned_short *)
         std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->changed_queue);
    bVar1 = __gnu_cxx::operator==(&this->changed_eating,&local_20);
    if (bVar1) {
      iVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                        (&this->changed_queue);
      (this->changed_eating)._M_current = iVar3._M_current;
    }
    return local_12;
  }
  __assert_fail("changed_eating != changed_feeding",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/GBuella[P]chipemu/src/nmos.cc"
                ,0x9b,"uint16_t chipemu::implementation::nmos::changed_pop()");
}

Assistant:

inline uint16_t
nmos::changed_pop()
{
    assert(changed_eating != changed_feeding);

    uint16_t id = *changed_eating;
    ++changed_eating;
    if (changed_eating == changed_queue.end()) {
        changed_eating = changed_queue.begin();
    }
    return id;
}